

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

ValueType ToWabtValueType(wasm_valkind_t kind)

{
  Enum EVar1;
  int iVar2;
  undefined7 in_register_00000039;
  
  iVar2 = (int)CONCAT71(in_register_00000039,kind);
  switch(CONCAT71(in_register_00000039,kind) & 0xffffffff) {
  case 0:
    EVar1 = I32;
    break;
  case 1:
    EVar1 = I64;
    break;
  case 2:
    EVar1 = F32;
    break;
  case 3:
    EVar1 = F64;
    break;
  default:
    if (iVar2 == 0x80) {
      EVar1 = Anyref;
    }
    else {
      if (iVar2 != 0x81) {
        fprintf(_stderr,"CAPI: [%s] unexpected wasm_valkind_t: %d\n","ToWabtValueType",kind);
        abort();
      }
      EVar1 = Funcref;
    }
  }
  return (ValueType)EVar1;
}

Assistant:

static ValueType ToWabtValueType(wasm_valkind_t kind) {
  switch (kind) {
    case WASM_I32:
      return ValueType::I32;
    case WASM_I64:
      return ValueType::I64;
    case WASM_F32:
      return ValueType::F32;
    case WASM_F64:
      return ValueType::F64;
    case WASM_ANYREF:
      return ValueType::Anyref;
    case WASM_FUNCREF:
      return ValueType::Funcref;
    default:
      TRACE("unexpected wasm_valkind_t: %d", kind);
      WABT_UNREACHABLE;
  }
  WABT_UNREACHABLE;
}